

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAtom.cpp
# Opt level: O0

void __thiscall OpenMD::DirectionalAtom::setA(DirectionalAtom *this,RotMat3x3d *a,int snapshotNo)

{
  long *plVar1;
  bool bVar2;
  undefined1 uVar3;
  long lVar4;
  Vector3<double> *this_00;
  SquareMatrix3<double> *pSVar5;
  undefined4 in_EDX;
  SquareMatrix3<double> *in_RDI;
  RotMat3x3d atrans;
  AtomType *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffee8;
  AtomType *in_stack_ffffffffffffff00;
  
  plVar1 = (long *)(in_RDI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
                   [0];
  lVar4 = (**(code **)(*plVar1 + 0x20))(plVar1,in_EDX);
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
              *)(lVar4 + (long)(in_RDI->super_SquareMatrix<double,_3>).
                               super_RectMatrix<double,_3U,_3U>.data_[0][2] + 0x48),
             (long)*(int *)(in_RDI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                           data_[2]);
  SquareMatrix3<double>::operator=
            ((SquareMatrix3<double> *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
             (SquareMatrix3<double> *)in_stack_fffffffffffffeb8);
  bVar2 = AtomType::isMultipole(in_stack_ffffffffffffff00);
  if (bVar2) {
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)in_stack_fffffffffffffee8);
    bVar2 = AtomType::isDipole(in_stack_fffffffffffffeb8);
    if (bVar2) {
      OpenMD::operator*(in_stack_fffffffffffffee8,(Vector<double,_3U> *)in_RDI);
      plVar1 = (long *)(in_RDI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_[1][0];
      this_00 = (Vector3<double> *)(**(code **)(*plVar1 + 0x20))(plVar1,in_EDX);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 ((long)this_00[10].super_Vector<double,_3U>.data_ +
                 (long)(in_RDI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_[0][2]),
                 (long)*(int *)(in_RDI->super_SquareMatrix<double,_3>).
                               super_RectMatrix<double,_3U,_3U>.data_[2]);
      Vector3<double>::operator=
                (this_00,(Vector<double,_3U> *)
                         CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    }
    uVar3 = AtomType::isQuadrupole(in_stack_fffffffffffffeb8);
    if ((bool)uVar3) {
      OpenMD::operator*((SquareMatrix3<double> *)in_stack_fffffffffffffee8,in_RDI);
      OpenMD::operator*((SquareMatrix3<double> *)in_stack_fffffffffffffee8,in_RDI);
      plVar1 = (long *)(in_RDI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_[1][0];
      pSVar5 = (SquareMatrix3<double> *)(**(code **)(*plVar1 + 0x20))(plVar1,in_EDX);
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                  *)((long)pSVar5[3].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                           data_[2] +
                    (long)(in_RDI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][2]),
                 (long)*(int *)(in_RDI->super_SquareMatrix<double,_3>).
                               super_RectMatrix<double,_3U,_3U>.data_[2]);
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)CONCAT17(uVar3,in_stack_fffffffffffffec0),pSVar5);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2e28cb);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2e28d5);
    }
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2e2924);
  }
  return;
}

Assistant:

void DirectionalAtom::setA(const RotMat3x3d& a, int snapshotNo) {
    ((snapshotMan_->getSnapshot(snapshotNo))->*storage_).aMat[localIndex_] = a;

    if (atomType_->isMultipole()) {
      RotMat3x3d atrans = a.transpose();

      if (atomType_->isDipole()) {
        ((snapshotMan_->getSnapshot(snapshotNo))->*storage_)
            .dipole[localIndex_] = atrans * dipole_;
      }

      if (atomType_->isQuadrupole()) {
        ((snapshotMan_->getSnapshot(snapshotNo))->*storage_)
            .quadrupole[localIndex_] = atrans * quadrupole_ * a;
      }
    }
  }